

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

void bam_plp_reset(bam_plp_t iter)

{
  __linkbuf_t *p_Var1;
  __linkbuf_t *p_Var2;
  mempool_t *pmVar3;
  lbnode_t *plVar4;
  int iVar5;
  lbnode_t **pplVar6;
  int iVar7;
  
  iter->tid = 0;
  iter->pos = 0;
  iter->max_tid = -1;
  iter->max_pos = -1;
  iter->is_eof = 0;
  p_Var1 = iter->head->next;
  plVar4 = iter->head;
  while (p_Var1 != (__linkbuf_t *)0x0) {
    overlap_remove((bam_plp_t)iter->overlaps,(bam1_t *)0x0);
    p_Var2 = plVar4->next;
    pmVar3 = iter->mp;
    pmVar3->cnt = pmVar3->cnt + -1;
    plVar4->next = (__linkbuf_t *)0x0;
    iVar7 = pmVar3->n;
    if (iVar7 == pmVar3->max) {
      iVar5 = iVar7 * 2;
      if (iVar7 == 0) {
        iVar5 = 0x100;
      }
      pmVar3->max = iVar5;
      pplVar6 = (lbnode_t **)realloc(pmVar3->buf,(long)iVar5 << 3);
      pmVar3->buf = pplVar6;
      iVar7 = pmVar3->n;
    }
    else {
      pplVar6 = pmVar3->buf;
    }
    pmVar3->n = iVar7 + 1;
    pplVar6[iVar7] = plVar4;
    plVar4 = p_Var2;
    p_Var1 = p_Var2->next;
  }
  iter->head = iter->tail;
  return;
}

Assistant:

void bam_plp_reset(bam_plp_t iter)
{
    lbnode_t *p, *q;
    iter->max_tid = iter->max_pos = -1;
    iter->tid = iter->pos = 0;
    iter->is_eof = 0;
    for (p = iter->head; p->next;) {
        overlap_remove(iter, NULL);
        q = p->next;
        mp_free(iter->mp, p);
        p = q;
    }
    iter->head = iter->tail;
}